

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::pushAndSubTable
          (AVisitor<hiberlite::KillChildren> *this,string *name)

{
  undefined1 local_78 [96];
  string *local_18;
  string *name_local;
  AVisitor<hiberlite::KillChildren> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  push(&this->stack,&this->scope);
  Scope::full_abi_cxx11_((Scope *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20),(char *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20));
  std::__cxx11::string::operator=((string *)&this->scope,(string *)(local_78 + 0x40));
  std::__cxx11::string::~string((string *)(local_78 + 0x40));
  std::__cxx11::string::~string((string *)(local_78 + 0x20));
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::operator=((string *)&(this->scope)._prefix,"");
  (this->scope).prefix_depth = 0;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubTable(std::string name)
{
	stack.push(scope);
	scope._table=scope.full()+"_"+name;
	scope._prefix="";
	scope.prefix_depth=0;
}